

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix3 * matrix3_translatev2(matrix3 *self,vector2 *translation)

{
  anon_union_36_5_d0a4420b_for_matrix3_0 local_30;
  
  local_30._0_8_ = 0x3f800000;
  local_30._12_8_ = 0x3f80000000000000;
  local_30._24_8_ = 0;
  local_30.m[8] = 1.0;
  local_30.m[2] = (translation->field_0).v[0];
  local_30.m[5] = (translation->field_0).v[1];
  matrix3_multiply(self,(matrix3 *)&local_30.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_translatev2(struct matrix3 *self, const struct vector2 *translation)
{
	struct matrix3 translationMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_translationv2(&translationMatrix, translation));
}